

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::ComputeTransformDetails(transform_info *Td,v3i *Dims3,int NPasses,u64 TformOrder)

{
  uint uVar1;
  int iVar2;
  u64 uVar3;
  int iVar4;
  u64 uVar5;
  u64 uVar6;
  uint uVar7;
  ulong uVar8;
  v3i R3;
  v3i D3;
  v3i S3;
  ulong local_168;
  uint local_160;
  ulong local_158;
  uint local_150;
  ulong local_14c;
  uint local_144;
  undefined1 local_140 [272];
  
  local_150 = (Dims3->field_0).field_0.Z;
  local_158 = *(ulong *)&Dims3->field_0;
  local_160 = (Dims3->field_0).field_0.Z;
  local_168 = *(ulong *)&Dims3->field_0;
  local_14c = 0x100000001;
  local_144 = 1;
  if (NPasses < 1) {
    iVar2 = 0;
  }
  else {
    uVar6 = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
            (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff |
            ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15;
    uVar5 = 0x40000200001;
    iVar2 = 0;
    iVar4 = 0;
    uVar3 = TformOrder;
    do {
      uVar7 = (uint)TformOrder;
      uVar1 = uVar7 & 3;
      TformOrder = TformOrder >> 2;
      if (uVar1 == 3) {
        if (TformOrder != 3) {
          uVar3 = TformOrder;
        }
        TformOrder = uVar3;
        uVar5 = (ulong)(local_144 & 0x1fffff) << 0x2a |
                (local_14c >> 0x20 & 0x1fffff) << 0x15 | local_14c & 0x1fffff;
        local_160 = local_150;
        uVar6 = (ulong)(local_150 & 0x1fffff) << 0x2a |
                (local_158 >> 0x20 & 0x1fffff) << 0x15 | local_158 & 0x1fffff;
        local_168 = local_158;
        iVar4 = iVar4 + 1;
        uVar3 = TformOrder;
      }
      else {
        if (0x1f < iVar2) {
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,
                        "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                       );
        }
        (Td->StackGrids).Arr[iVar2].super_extent.From = 0;
        (Td->StackGrids).Arr[iVar2].super_extent.Dims = uVar6;
        (Td->StackGrids).Arr[iVar2].Strd = uVar5;
        (Td->StackAxes).Arr[iVar2] = uVar1;
        iVar2 = iVar2 + 1;
        uVar8 = (ulong)((uVar7 & 3) << 2);
        uVar1 = *(uint *)((long)&local_158 + uVar8) | 1;
        *(uint *)((long)&local_168 + uVar8) = uVar1;
        uVar6 = (ulong)(local_160 & 0x1fffff) << 0x2a |
                (local_168 >> 0x20 & 0x1fffff) << 0x15 | local_168 & 0x1fffff;
        *(int *)((long)&local_158 + uVar8) = (int)(uVar1 + 1) >> 1;
        *(int *)((long)&local_14c + uVar8) = *(int *)((long)&local_14c + uVar8) << 1;
      }
    } while (iVar4 < NPasses);
  }
  Td->TformOrder = TformOrder;
  Td->StackSize = iVar2;
  GetCdf53NormsFast<16>();
  memcpy(Td,local_140,0x110);
  Td->NPasses = NPasses;
  return;
}

Assistant:

void
ComputeTransformDetails(transform_info* Td, const v3i& Dims3, int NPasses, u64 TformOrder)
{
  int Pass = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int StackSize = 0;
  while (Pass < NPasses)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Pass;
    }
    else
    {
      Td->StackGrids[StackSize] = G;
      Td->StackAxes[StackSize++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }
  Td->TformOrder = TformOrder;
  Td->StackSize = StackSize;
  Td->BasisNorms = GetCdf53NormsFast<16>();
  Td->NPasses = NPasses;
}